

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandEliminate(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  Abc_Ntk_t *pNtk_00;
  char *pcVar4;
  uint local_4c;
  int c;
  int fVerbose;
  int fSpecial;
  int fReverse;
  int fGreedy;
  int nIterMax;
  int nMaxSize;
  int ElimValue;
  Abc_Ntk_t *pNtk;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  pNtk_00 = Abc_FrameReadNtk(pAbc);
  nIterMax = -1;
  fGreedy = 0xc;
  fReverse = 1;
  bVar2 = false;
  fVerbose = 0;
  bVar1 = false;
  local_4c = 0;
  Extra_UtilGetoptReset();
LAB_0022b718:
  iVar3 = Extra_UtilGetopt(argc,argv,"VNIgrsvh");
  if (iVar3 == -1) {
    if (pNtk_00 == (Abc_Ntk_t *)0x0) {
      Abc_Print(-1,"Empty network.\n");
      return 1;
    }
    iVar3 = Abc_NtkNodeNum(pNtk_00);
    if (iVar3 == 0) {
      Abc_Print(-1,"The network does not have internal nodes.\n");
      return 1;
    }
    iVar3 = Abc_NtkIsLogic(pNtk_00);
    if (iVar3 == 0) {
      Abc_Print(-1,
                "This command can only be applied to a logic network (run \"renode\" or \"if\").\n")
      ;
      return 1;
    }
    if (bVar1) {
      Abc_NtkEliminateSpecial(pNtk_00,1000,local_4c);
    }
    else if (bVar2) {
      Abc_NtkEliminate(pNtk_00,fGreedy,fVerbose,local_4c);
    }
    else {
      Abc_NtkEliminate1(pNtk_00,nIterMax,fGreedy,fReverse,fVerbose,local_4c);
    }
    return 0;
  }
  switch(iVar3) {
  case 0x49:
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-I\" should be followed by a positive integer.\n");
      goto LAB_0022b9a2;
    }
    fReverse = atoi(argv[globalUtilOptind]);
    iVar3 = fReverse;
    break;
  default:
    goto LAB_0022b9a2;
  case 0x4e:
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-N\" should be followed by a positive integer.\n");
      goto LAB_0022b9a2;
    }
    fGreedy = atoi(argv[globalUtilOptind]);
    iVar3 = fGreedy;
    break;
  case 0x56:
    if (globalUtilOptind < argc) goto LAB_0022b786;
    Abc_Print(-1,
              "Command line switch \"-V\" should be followed by an integer that is -1 or larger.\n")
    ;
    goto LAB_0022b9a2;
  case 0x67:
    bVar2 = (bool)(bVar2 ^ 1);
    goto LAB_0022b718;
  case 0x68:
    goto LAB_0022b9a2;
  case 0x72:
    fVerbose = fVerbose ^ 1;
    goto LAB_0022b718;
  case 0x73:
    bVar1 = (bool)(bVar1 ^ 1);
    goto LAB_0022b718;
  case 0x76:
    local_4c = local_4c ^ 1;
    goto LAB_0022b718;
  }
  globalUtilOptind = globalUtilOptind + 1;
  if (iVar3 < 1) goto LAB_0022b9a2;
  goto LAB_0022b718;
LAB_0022b786:
  nIterMax = atoi(argv[globalUtilOptind]);
  globalUtilOptind = globalUtilOptind + 1;
  if (nIterMax < -1) {
LAB_0022b9a2:
    Abc_Print(-2,"usage: eliminate [-VNI <num>] [-grsvh]\n");
    Abc_Print(-2,
              "\t           traditional \"eliminate -1\", which collapses the node into its fanout\n"
             );
    Abc_Print(-2,
              "\t           if the node\'s variable appears in the fanout\'s factored form only once\n"
             );
    Abc_Print(-2,
              "\t-V <num> : the \"value\" parameter used by \"eliminate\" in SIS [default = %d]\n",
              (ulong)(uint)nIterMax);
    Abc_Print(-2,"\t-N <num> : the maximum node support after collapsing [default = %d]\n",
              (ulong)(uint)fGreedy);
    Abc_Print(-2,"\t-I <num> : the maximum number of iterations [default = %d]\n",
              (ulong)(uint)fReverse);
    pcVar4 = "no";
    if (bVar2) {
      pcVar4 = "yes";
    }
    Abc_Print(-2,"\t-g       : toggle using greedy eliminate (without \"value\") [default = %s]\n",
              pcVar4);
    pcVar4 = "no";
    if (fVerbose != 0) {
      pcVar4 = "yes";
    }
    Abc_Print(-2,"\t-r       : use the reverse topological order [default = %s]\n",pcVar4);
    pcVar4 = "no";
    if (bVar1) {
      pcVar4 = "yes";
    }
    Abc_Print(-2,"\t-s       : toggle eliminating similar nodes [default = %s]\n",pcVar4);
    pcVar4 = "no";
    if (local_4c != 0) {
      pcVar4 = "yes";
    }
    Abc_Print(-2,"\t-v       : print verbose information [default = %s]\n",pcVar4);
    Abc_Print(-2,"\t-h       : print the command usage\n");
    return 1;
  }
  goto LAB_0022b718;
}

Assistant:

int Abc_CommandEliminate( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    int ElimValue;
    int nMaxSize;
    int nIterMax;
    int fGreedy;
    int fReverse;
    int fSpecial;
    int fVerbose;
    int c;
    extern int Abc_NtkEliminate( Abc_Ntk_t * pNtk, int nMaxSize, int fReverse, int fVerbose );
    extern int Abc_NtkEliminate1( Abc_Ntk_t * pNtk, int ElimValue, int nMaxSize, int nIterMax, int fReverse, int fVerbose );
    extern int Abc_NtkEliminateSpecial( Abc_Ntk_t * pNtk, int nMaxSize, int fVerbose );

    // set the defaults
    ElimValue = -1;
    nMaxSize  = 12;
    nIterMax  =  1;
    fGreedy   =  0;
    fReverse  =  0;
    fSpecial  =  0;
    fVerbose  =  0;
    Extra_UtilGetoptReset();
    while ( (c = Extra_UtilGetopt(argc, argv, "VNIgrsvh")) != EOF )
    {
        switch (c)
        {
            case 'V':
                if ( globalUtilOptind >= argc )
                {
                    Abc_Print( -1, "Command line switch \"-V\" should be followed by an integer that is -1 or larger.\n" );
                    goto usage;
                }
                ElimValue = atoi(argv[globalUtilOptind]);
                globalUtilOptind++;
                if ( ElimValue < -1 )
                    goto usage;
                break;
            case 'N':
                if ( globalUtilOptind >= argc )
                {
                    Abc_Print( -1, "Command line switch \"-N\" should be followed by a positive integer.\n" );
                    goto usage;
                }
                nMaxSize = atoi(argv[globalUtilOptind]);
                globalUtilOptind++;
                if ( nMaxSize <= 0 )
                    goto usage;
                break;
            case 'I':
                if ( globalUtilOptind >= argc )
                {
                    Abc_Print( -1, "Command line switch \"-I\" should be followed by a positive integer.\n" );
                    goto usage;
                }
                nIterMax = atoi(argv[globalUtilOptind]);
                globalUtilOptind++;
                if ( nIterMax <= 0 )
                    goto usage;
                break;
            case 'g':
                fGreedy ^= 1;
                break;
            case 'r':
                fReverse ^= 1;
                break;
            case 's':
                fSpecial ^= 1;
                break;
            case 'v':
                fVerbose ^= 1;
                break;
            case 'h':
                goto usage;
                break;
            default:
                goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }

    if ( Abc_NtkNodeNum(pNtk) == 0 )
    {
        Abc_Print( -1, "The network does not have internal nodes.\n" );
        return 1;
    }

    if ( !Abc_NtkIsLogic(pNtk) )
    {
        Abc_Print( -1, "This command can only be applied to a logic network (run \"renode\" or \"if\").\n" );
        return 1;
    }

    if ( fSpecial )
        Abc_NtkEliminateSpecial( pNtk, 1000, fVerbose );
    else if ( fGreedy )
        Abc_NtkEliminate( pNtk, nMaxSize, fReverse, fVerbose );
    else
        Abc_NtkEliminate1( pNtk, ElimValue, nMaxSize, nIterMax, fReverse, fVerbose );
    return 0;

usage:
    Abc_Print( -2, "usage: eliminate [-VNI <num>] [-grsvh]\n");
    Abc_Print( -2, "\t           traditional \"eliminate -1\", which collapses the node into its fanout\n");
    Abc_Print( -2, "\t           if the node's variable appears in the fanout's factored form only once\n");
    Abc_Print( -2, "\t-V <num> : the \"value\" parameter used by \"eliminate\" in SIS [default = %d]\n", ElimValue );
    Abc_Print( -2, "\t-N <num> : the maximum node support after collapsing [default = %d]\n", nMaxSize );
    Abc_Print( -2, "\t-I <num> : the maximum number of iterations [default = %d]\n", nIterMax );
    Abc_Print( -2, "\t-g       : toggle using greedy eliminate (without \"value\") [default = %s]\n", fGreedy? "yes": "no" );
    Abc_Print( -2, "\t-r       : use the reverse topological order [default = %s]\n", fReverse? "yes": "no" );
    Abc_Print( -2, "\t-s       : toggle eliminating similar nodes [default = %s]\n", fSpecial? "yes": "no" );
    Abc_Print( -2, "\t-v       : print verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h       : print the command usage\n");
    return 1;
}